

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrapTCPService.cpp
# Opt level: O2

bool __thiscall
brynet::net::WrapTcpService::_addSession
          (WrapTcpService *this,PTR *socket,
          vector<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
          *optionFuncs)

{
  pointer pfVar1;
  TcpService *this_00;
  bool bVar2;
  __0 *this_01;
  __shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  function<void_(brynet::net::AddSessionOption::Options_&)> *v;
  pointer this_02;
  PTR *pPVar4;
  _Head_base<0UL,_brynet::net::TcpSocket_*,_false> local_240;
  PTR tmpSession;
  AddSocketOptionFunc local_228;
  anon_class_16_1_bbef8b3d msgCallback;
  anon_class_16_1_bbef8b3d closeCallback;
  AddSocketOptionFunc sslOption;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  __shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2> local_168;
  PTR sharedTCPService;
  Options options;
  AddSocketOptionFunc local_108;
  AddSocketOptionFunc local_e8;
  anon_class_64_3_faec5c49 enterCallback;
  SESSION_ENTER_CALLBACK userEnterCallback;
  function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> local_68;
  function<void_(brynet::net::TcpService::AddSocketOption::Options_&)> local_48;
  
  options.maxRecvBufferSize = 0;
  options.enterCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  options.enterCallback.super__Function_base._M_functor._8_8_ = 0;
  options.useSSL = false;
  options.forceSameThreadLoop = false;
  options.enterCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  options.enterCallback._M_invoker = (_Invoker_type)0x0;
  options.sslHelper.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  options.sslHelper.super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pfVar1 = (optionFuncs->
           super__Vector_base<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (optionFuncs->
                 super__Vector_base<std::function<void_(brynet::net::AddSessionOption::Options_&)>,_std::allocator<std::function<void_(brynet::net::AddSessionOption::Options_&)>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; this_02 != pfVar1;
      this_02 = this_02 + 1) {
    if ((this_02->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(brynet::net::AddSessionOption::Options_&)>::operator()(this_02,&options);
    }
  }
  TCPSession::Create();
  pPVar4 = &this->mTCPService;
  std::__shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((tmpSession.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->mService).
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>,
             &pPVar4->super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>);
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::function
            (&userEnterCallback,&options.enterCallback);
  std::__shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&sharedTCPService.
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>,
             &pPVar4->super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> *)&enterCallback,
             &sharedTCPService.
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&enterCallback.tmpSession.
              super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>,
             &tmpSession.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>);
  std::function<void_(const_std::shared_ptr<brynet::net::TCPSession>_&)>::function
            (&enterCallback.userEnterCallback,&userEnterCallback);
  std::__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2> *)&closeCallback,
             &tmpSession.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2> *)&msgCallback,
             &tmpSession.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>);
  sslOption.super__Function_base._M_manager = (_Manager_type)0x0;
  sslOption._M_invoker = (_Invoker_type)0x0;
  sslOption.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  sslOption.super__Function_base._M_functor._8_8_ = 0;
  if (options.useSSL == true) {
    bVar2 = TcpSocket::isServerSide
                      ((socket->_M_t).
                       super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>
                       .super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl);
    if (bVar2) {
      std::__shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_168,
                 &options.sslHelper.
                  super___shared_ptr<brynet::net::SSLHelper,_(__gnu_cxx::_Lock_policy)2>);
      TcpService::AddSocketOption::WithServerSideSSL(&local_228,(PTR *)&local_168);
      std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::operator=
                (&sslOption,&local_228);
      std::_Function_base::~_Function_base(&local_228.super__Function_base);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
    }
    else {
      TcpService::AddSocketOption::WithClientSideSSL();
      std::function<void_(brynet::net::TcpService::AddSocketOption::Options_&)>::operator=
                (&sslOption,&local_228);
      std::_Function_base::~_Function_base(&local_228.super__Function_base);
    }
  }
  this_00 = (pPVar4->super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_240._M_head_impl =
       (socket->_M_t).
       super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
       super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
       super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl;
  (socket->_M_t).
  super___uniq_ptr_impl<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>._M_t.
  super__Tuple_impl<0UL,_brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>.
  super__Head_base<0UL,_brynet::net::TcpSocket_*,_false>._M_head_impl = (TcpSocket *)0x0;
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_178 = (code *)0x0;
  pcStack_170 = (code *)0x0;
  this_01 = (__0 *)operator_new(0x40);
  _addSession(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>,std::vector<std::function<void(brynet::net::AddSessionOption::Options&)>,std::allocator<std::function<void(brynet::net::AddSessionOption::Options&)>>>const&)
  ::$_0::__0(this_01,&enterCallback);
  pcStack_170 = std::
                _Function_handler<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:211:26)>
                ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:211:26)>
              ::_M_manager;
  local_188._M_unused._0_8_ = (undefined8)this_01;
  TcpService::AddSocketOption::WithEnterCallback(&local_228,(ENTER_CALLBACK *)&local_188);
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  local_198 = (code *)0x0;
  pcStack_190 = (code *)0x0;
  p_Var3 = (__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x10);
  std::__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (p_Var3,(__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2> *)
                    &closeCallback);
  pcStack_190 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:224:26)>
                ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:224:26)>
              ::_M_manager;
  local_1a8._M_unused._M_object = p_Var3;
  TcpService::AddSocketOption::WithDisconnectCallback(&local_e8,(DISCONNECT_CALLBACK *)&local_1a8);
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_1b8 = (code *)0x0;
  pcStack_1b0 = (code *)0x0;
  p_Var3 = (__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x10);
  std::__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (p_Var3,(__shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2> *)
                    &msgCallback);
  pcStack_1b0 = std::
                _Function_handler<unsigned_long_(long,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:232:24)>
                ::_M_invoke;
  local_1b8 = std::
              _Function_handler<unsigned_long_(long,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/WrapTCPService.cpp:232:24)>
              ::_M_manager;
  local_1c8._M_unused._M_object = p_Var3;
  TcpService::AddSocketOption::WithDataCallback(&local_108,(DATA_CALLBACK *)&local_1c8);
  TcpService::AddSocketOption::WithMaxRecvBufferSize(options.maxRecvBufferSize);
  TcpService::AddSocketOption::WithForceSameThreadLoop(options.forceSameThreadLoop);
  bVar2 = TcpService::
          addDataSocket<std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>,std::function<void(brynet::net::TcpService::AddSocketOption::Options&)>>
                    (this_00,(PTR *)&local_240,&sslOption,&local_228,&local_e8,&local_108,&local_48,
                     &local_68);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  std::_Function_base::~_Function_base(&local_108.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
  std::_Function_base::~_Function_base(&local_e8.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  std::_Function_base::~_Function_base(&local_228.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  if (local_240._M_head_impl != (TcpSocket *)0x0) {
    (*(local_240._M_head_impl)->_vptr_TcpSocket[1])();
  }
  local_240._M_head_impl = (TcpSocket *)0x0;
  std::_Function_base::~_Function_base(&sslOption.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&msgCallback.tmpSession.
              super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&closeCallback.tmpSession.
              super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _addSession(std::unique_ptr<brynet::net::TcpSocket,brynet::net::TcpSocket::TcpSocketDeleter>,std::vector<std::function<void(brynet::net::AddSessionOption::Options&)>,std::allocator<std::function<void(brynet::net::AddSessionOption::Options&)>>>const&)
  ::$_0::~__0((__0 *)&enterCallback);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sharedTCPService.
              super___shared_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base(&userEnterCallback.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tmpSession.super___shared_ptr<brynet::net::TCPSession,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  AddSessionOption::Options::~Options(&options);
  return bVar2;
}

Assistant:

bool WrapTcpService::_addSession(TcpSocket::PTR socket,
    const std::vector<AddSessionOption::AddSessionOptionFunc>& optionFuncs)
{
    struct AddSessionOption::Options options;
    for (const auto& v : optionFuncs)
    {
        if (v != nullptr)
        {
            v(options);
        }
    }

    auto tmpSession = TCPSession::Create();
    tmpSession->setService(mTCPService);

    auto userEnterCallback = options.enterCallback;
    auto sharedTCPService = mTCPService;
    auto enterCallback = [sharedTCPService,
        tmpSession,
        userEnterCallback](TcpService::SESSION_TYPE id,
            const std::string& ip) mutable {
        tmpSession->setIOLoopData(sharedTCPService->getIOLoopDataBySocketID(id));
        tmpSession->setSocketID(id);
        tmpSession->setIP(ip);
        if (userEnterCallback != nullptr)
        {
            userEnterCallback(tmpSession);
        }
    };

    auto closeCallback = [tmpSession](TcpService::SESSION_TYPE id) mutable {
        const auto& callback = tmpSession->getCloseCallback();
        if (callback != nullptr)
        {
            callback(tmpSession);
        }
    };

    auto msgCallback = [tmpSession](TcpService::SESSION_TYPE id,
        const char* buffer,
        size_t len) mutable {
        const auto& callback = tmpSession->getDataCallback();
        if (callback != nullptr)
        {
            return callback(tmpSession, buffer, len);
        }
        else
        {
            return static_cast<size_t>(0);
        }
    };

    TcpService::AddSocketOption::AddSocketOptionFunc sslOption;
    if (options.useSSL)
    {
        if (socket->isServerSide())
        {
            sslOption = TcpService::AddSocketOption::WithServerSideSSL(options.sslHelper);
        }
        else
        {
            sslOption = TcpService::AddSocketOption::WithClientSideSSL();
        }
    }

    return mTCPService->addDataSocket(std::move(socket),
        sslOption,
        TcpService::AddSocketOption::WithEnterCallback(enterCallback),
        TcpService::AddSocketOption::WithDisconnectCallback(closeCallback),
        TcpService::AddSocketOption::WithDataCallback(msgCallback),
        TcpService::AddSocketOption::WithMaxRecvBufferSize(options.maxRecvBufferSize),
        TcpService::AddSocketOption::WithForceSameThreadLoop(options.forceSameThreadLoop));
}